

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

int pbrt::rply_face_callback(p_ply_argument argument)

{
  char *unaff_RBX;
  p_ply_argument in_RDI;
  double dVar1;
  LogLevel unaff_retaddr;
  char (*in_stack_00000010) [7];
  long *in_stack_00000018;
  char (*in_stack_00000020) [2];
  int *in_stack_00000028;
  int vb;
  long va;
  int i;
  long value_index;
  long length;
  long flags;
  FaceCallbackContext *context;
  value_type_conflict *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  long local_38;
  long local_30;
  char (*in_stack_ffffffffffffffd8) [2];
  char (*in_stack_ffffffffffffffe0) [7];
  int in_stack_fffffffffffffff4;
  
  ply_get_argument_user_data
            (in_RDI,(void **)&stack0xffffffffffffffe0,(long *)&stack0xffffffffffffffd8);
  ply_get_argument_property(in_RDI,(p_ply_property_conflict *)0x0,&local_30,&local_38);
  if ((local_30 == 3) || (local_30 == 4)) {
    if (-1 < local_38) {
      if (-1 < local_38) {
        dVar1 = ply_get_argument_value(in_RDI);
        *(int *)(*in_stack_ffffffffffffffe0 + local_38 * 4) = (int)dVar1;
      }
      if (local_38 == local_30 + -1) {
        if (local_30 == 3) {
          for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          }
        }
        else {
          if (local_30 != 4) {
            LogFatal<char_const(&)[7],char_const(&)[2],char_const(&)[7],long&,char_const(&)[2],int&>
                      (unaff_retaddr,unaff_RBX,in_stack_fffffffffffffff4,(char *)in_RDI,
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_00000010,
                       in_stack_00000018,in_stack_00000020,in_stack_00000028);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
    }
  }
  else {
    Warning<int>((char *)CONCAT44((int)local_30,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
                );
  }
  return 1;
}

Assistant:

int rply_face_callback(p_ply_argument argument) {
    FaceCallbackContext *context;
    long flags;
    ply_get_argument_user_data(argument, (void **)&context, &flags);

    long length, value_index;
    ply_get_argument_property(argument, nullptr, &length, &value_index);

    if (length != 3 && length != 4) {
        Warning("plymesh: Ignoring face with %i vertices (only triangles and quads "
                "are supported!)",
                (int)length);
        return 1;
    } else if (value_index < 0) {
        return 1;
    }

    if (value_index >= 0)
        context->face[value_index] = (int)ply_get_argument_value(argument);

    if (value_index == length - 1) {
        if (length == 3)
            for (int i = 0; i < 3; ++i)
                context->triIndices.push_back(context->face[i]);
        else {
            CHECK_EQ(length, 4);

            // Note: modify order since we're specifying it as a blp...
            context->quadIndices.push_back(context->face[0]);
            context->quadIndices.push_back(context->face[1]);
            context->quadIndices.push_back(context->face[3]);
            context->quadIndices.push_back(context->face[2]);
        }
    }

    return 1;
}